

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O1

FButtonStatus * FindButton(uint key)

{
  uint uVar1;
  FActionMap *in_RAX;
  int min;
  uint uVar2;
  int iVar3;
  int iVar4;
  
  iVar3 = 0x1f;
  iVar4 = 0;
  do {
    if (iVar3 < iVar4) {
      in_RAX = (FActionMap *)0x0;
      break;
    }
    uVar2 = (uint)(iVar3 + iVar4) >> 1;
    uVar1 = ActionMaps[uVar2].Key;
    if (uVar1 == key) {
      in_RAX = ActionMaps + uVar2;
    }
    else if (uVar1 < key) {
      iVar4 = uVar2 + 1;
    }
    else {
      iVar3 = uVar2 - 1;
    }
  } while (uVar1 != key);
  if (in_RAX == (FActionMap *)0x0) {
    return (FButtonStatus *)0x0;
  }
  return in_RAX->Button;
}

Assistant:

FButtonStatus *FindButton (unsigned int key)
{
	const FActionMap *bit;

	bit = BinarySearch<FActionMap, unsigned int>
			(ActionMaps, NUM_ACTIONS, &FActionMap::Key, key);
	return bit ? bit->Button : NULL;
}